

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::parseParameters(MipsParser *this,Parser *parser,tMipsOpcode *opcode)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined4 uVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  Token *pTVar10;
  MipsRegisterValue *pMVar11;
  byte *pbVar12;
  MipsParser *this_00;
  char *encoding;
  MipsRegisterValue tempRegister;
  undefined1 local_128 [48];
  MipsRegisterValue *local_f8;
  _Alloc_hider local_f0;
  MipsRegisterValue *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  MipsRegisterValue *local_d0;
  MipsRegisterValue *local_c8;
  _Alloc_hider local_c0;
  MipsRegisterValue *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  MipsRegisterValue *local_a0;
  MipsRegisterValue *local_98;
  _Alloc_hider local_90;
  MipsRegisterValue *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  MipsRegisterValue *local_70;
  Expression *local_68;
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  MipsRegisterType local_38;
  
  local_128._0_8_ = opcode->encoding;
  (this->immediate).primary.type = None;
  if (this->hasFixedSecondaryImmediate == false) {
    (this->immediate).secondary.type = None;
  }
  if ((this->opcodeData).vfpuSize == -1) {
    uVar2 = opcode->flags;
    iVar9 = 0;
    if (((((uVar2 >> 0x13 & 1) != 0) || (iVar9 = 1, (uVar2 >> 0x16 & 1) != 0)) ||
        (iVar9 = 2, (uVar2 >> 0x17 & 1) != 0)) || (iVar9 = 3, (uVar2 >> 0x14 & 1) != 0)) {
      (this->opcodeData).vfpuSize = iVar9;
    }
  }
  local_48._8_8_ = 0;
  local_60._16_8_ = 0;
  local_48._M_allocated_capacity = 0;
  bVar7 = *(byte *)local_128._0_8_;
  local_60._8_8_ = &local_48;
  if (bVar7 == 0) {
LAB_0016a06a:
    pcVar3 = opcode->name;
    pcVar4 = opcode->encoding;
    iVar9 = opcode->archs;
    iVar5 = opcode->flags;
    uVar6 = *(undefined4 *)&opcode->field_0x1c;
    (this->opcodeData).opcode.destencoding = opcode->destencoding;
    (this->opcodeData).opcode.archs = iVar9;
    (this->opcodeData).opcode.flags = iVar5;
    *(undefined4 *)&(this->opcodeData).opcode.field_0x1c = uVar6;
    (this->opcodeData).opcode.name = pcVar3;
    (this->opcodeData).opcode.encoding = pcVar4;
    setOmittedRegisters(this,opcode);
    pTVar10 = Tokenizer::nextToken
                        ((parser->entries).
                         super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    bVar8 = pTVar10->type == Separator;
switchD_00169a73_caseD_64:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._8_8_ != &local_48) {
      operator_delete((void *)local_60._8_8_,local_48._M_allocated_capacity + 1);
    }
    return bVar8;
  }
  local_80._8_8_ = &this->immediate;
  local_128._12_4_ = (this->opcodeData).vfpuSize;
  local_128._32_8_ = &(this->immediate).primary.originalValue;
  local_80._M_allocated_capacity = (size_type)&(this->opcodeData).vectorCondition;
  local_b0._8_8_ = &(this->immediate).secondary.originalValue;
  local_f0._M_p = (pointer)&(this->immediate).secondary.expression;
  local_68 = &(this->immediate).primary.expression;
  local_b0._M_allocated_capacity = (size_type)&(this->registers).rspvealt;
  local_b8 = &(this->registers).rspvde;
  local_e8 = &(this->registers).rspve;
  local_c0._M_p = (pointer)&(this->registers).rspvrs;
  local_c8 = &(this->registers).rspvrd;
  local_d0 = &(this->registers).rspvrt;
  local_128._16_8_ = &(this->registers).grd;
  local_e0._M_allocated_capacity = (size_type)&(this->registers).grt;
  local_90._M_p = (pointer)&(this->registers).ps2vrs;
  local_98 = &(this->registers).ps2vrd;
  local_a0 = &(this->registers).ps2vrt;
  local_128._24_8_ = &(this->registers).vrd;
  local_f8 = &(this->registers).vrt;
  local_128._40_8_ = &(this->registers).vrs;
  local_e0._8_8_ = &(this->registers).frs;
  local_88 = &(this->registers).frd;
  local_70 = &(this->registers).frt;
  pbVar12 = (byte *)local_128._0_8_;
  this_00 = this;
LAB_00169975:
  local_128._0_8_ = pbVar12 + 1;
  switch(bVar7) {
  case 0x52:
    local_128._0_8_ = pbVar12 + 2;
    bVar8 = false;
    switch(pbVar12[1]) {
    case 99:
      bVar8 = parseRspVectorControlRegister(this_00,parser,(MipsRegisterValue *)local_128._16_8_);
      break;
    case 100:
      local_c8->type = RspVector;
      bVar8 = parseRegisterTable(this_00,parser,local_c8,mipsRspVectorRegisters,0x2a);
      break;
    case 0x65:
      bVar8 = parseRspVectorElement(this_00,parser,local_e8);
      break;
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
      goto switchD_00169a73_caseD_64;
    case 0x6c:
      bVar8 = parseRspScalarElement(this_00,parser,local_e8);
      break;
    case 0x6d:
      bVar8 = parseRspScalarElement(this_00,parser,local_b8);
      break;
    case 0x6f:
      bVar8 = parseRspOffsetElement
                        (this_00,parser,(MipsRegisterValue *)local_b0._M_allocated_capacity);
      break;
    case 0x73:
      local_c0._M_p[0] = '\n';
      local_c0._M_p[1] = '\0';
      local_c0._M_p[2] = '\0';
      local_c0._M_p[3] = '\0';
      bVar8 = parseRegisterTable(this_00,parser,(MipsRegisterValue *)local_c0._M_p,
                                 mipsRspVectorRegisters,0x2a);
      break;
    case 0x74:
      local_d0->type = RspVector;
      bVar8 = parseRegisterTable(this_00,parser,local_d0,mipsRspVectorRegisters,0x2a);
      break;
    default:
      if (pbVar12[1] != 0x7a) goto switchD_00169a73_caseD_64;
      bVar8 = parseRspCop0Register(this_00,parser,(MipsRegisterValue *)local_128._16_8_);
    }
    break;
  case 0x53:
    bVar8 = parseFpuRegister(this_00,parser,(MipsRegisterValue *)local_e0._8_8_);
    break;
  case 0x54:
    bVar8 = parseFpuRegister(this_00,parser,local_70);
    break;
  case 0x55:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0x65:
  case 0x68:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x78:
  case 0x79:
switchD_00169990_caseD_55:
    bVar8 = matchSymbol(this_00,parser,bVar7);
    break;
  case 0x56:
    local_128._0_8_ = pbVar12 + 2;
    bVar7 = pbVar12[1];
    if (bVar7 == 100) {
      local_98->type = Ps2Cop2;
      bVar8 = parseRegisterTable(this_00,parser,local_98,mipsPs2Cop2FpRegisters,0x2a);
    }
    else if (bVar7 == 0x73) {
      local_90._M_p[0] = '\x04';
      local_90._M_p[1] = '\0';
      local_90._M_p[2] = '\0';
      local_90._M_p[3] = '\0';
      bVar8 = parseRegisterTable(this_00,parser,(MipsRegisterValue *)local_90._M_p,
                                 mipsPs2Cop2FpRegisters,0x2a);
    }
    else {
      if (bVar7 != 0x74) goto LAB_0016a0a3;
      local_a0->type = Ps2Cop2;
      bVar8 = parseRegisterTable(this_00,parser,local_a0,mipsPs2Cop2FpRegisters,0x2a);
    }
    break;
  case 0x57:
    local_128._0_8_ = pbVar12 + 2;
    bVar7 = pbVar12[1];
    bVar8 = false;
    if (bVar7 < 0x72) {
      if (bVar7 == 99) {
        bVar8 = parseVcstParameter(this_00,parser,(int *)local_128._32_8_);
LAB_00169f20:
        if (bVar8 == false) goto LAB_0016a0a3;
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate5;
        goto LAB_0016a05b;
      }
      if (bVar7 != 100) goto switchD_00169a73_caseD_64;
      bVar8 = parseVpfxdParameter(this_00,parser,(int *)local_128._32_8_);
      if (!bVar8) goto LAB_0016a0a3;
      (this->immediate).primary.value = (this->immediate).primary.originalValue;
      (this->immediate).primary.type = Immediate16;
    }
    else {
      if (bVar7 == 0x72) {
        bVar8 = parseVfpuVrot(this_00,parser,(int *)local_128._32_8_,(this->opcodeData).vfpuSize);
        goto LAB_00169f20;
      }
      if (bVar7 != 0x73) goto switchD_00169a73_caseD_64;
      bVar8 = parseVpfxsParameter(this_00,parser,(int *)local_128._32_8_);
      if (!bVar8) goto LAB_0016a0a3;
      (this->immediate).primary.value = (this->immediate).primary.originalValue;
      (this->immediate).primary.type = Immediate20_0;
    }
    goto LAB_0016a05b;
  case 100:
    bVar8 = parseRegister(this_00,parser,(MipsRegisterValue *)local_128._16_8_);
    break;
  case 0x66:
    bVar8 = parseFpuControlRegister(this_00,parser,(MipsRegisterValue *)local_e0._8_8_);
    break;
  case 0x67:
    local_128._0_8_ = pbVar12 + 2;
    bVar7 = pbVar12[1];
    if (bVar7 == 99) {
      bVar8 = parsePsxCop2ControlRegister(this_00,parser,(MipsRegisterValue *)local_128._16_8_);
    }
    else if (bVar7 == 0x73) {
      bVar8 = parsePsxCop2DataRegister(this_00,parser,(MipsRegisterValue *)local_128._16_8_);
    }
    else {
      if (bVar7 != 0x74) goto LAB_0016a0a3;
      bVar8 = parsePsxCop2DataRegister
                        (this_00,parser,(MipsRegisterValue *)local_e0._M_allocated_capacity);
    }
    break;
  case 0x69:
    bVar8 = parseImmediate(this_00,parser,local_68);
    if (bVar8) {
      this_00 = (MipsParser *)local_128;
      bVar8 = decodeImmediateSize((char **)local_128,(MipsImmediateType *)local_80._8_8_);
      break;
    }
    goto LAB_0016a0a3;
  case 0x6a:
    local_128._0_8_ = pbVar12 + 2;
    bVar8 = false;
    switch(pbVar12[1]) {
    case 0x62:
      bVar8 = parseCop2BranchCondition(this_00,parser,(int *)local_b0._8_8_);
      if (!bVar8) goto LAB_0016a0a3;
      (this->immediate).secondary.type = Cop2BranchType;
      (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
      break;
    case 99:
      bVar8 = parseImmediate(this_00,parser,(Expression *)local_f0._M_p);
      if (!bVar8) goto LAB_0016a0a3;
      (this->immediate).secondary.type = CacheOp;
      break;
    default:
      goto switchD_00169a73_caseD_64;
    case 0x65:
      bVar8 = parseImmediate(this_00,parser,(Expression *)local_f0._M_p);
      if (!bVar8) goto LAB_0016a0a3;
      (this->immediate).secondary.type = Ext;
      break;
    case 0x69:
      bVar8 = parseImmediate(this_00,parser,(Expression *)local_f0._M_p);
      if (!bVar8) goto LAB_0016a0a3;
      (this->immediate).secondary.type = Ins;
    }
    goto LAB_0016a05b;
  case 0x6d:
    local_128._0_8_ = pbVar12 + 2;
    bVar7 = pbVar12[1];
    if (bVar7 == 100) {
      bVar8 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_128._24_8_,
                                (this->opcodeData).vfpuSize);
      pMVar11 = (MipsRegisterValue *)local_128._24_8_;
    }
    else {
      if (bVar7 != 0x74) {
        if ((bVar7 != 0x73) ||
           (bVar8 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_128._40_8_,
                                      (this->opcodeData).vfpuSize),
           !bVar8 || *(MipsRegisterType *)local_128._40_8_ != VfpuMatrix)) goto LAB_0016a0a3;
        if ((opcode->flags & 0x200000) != 0) {
          piVar1 = &(this->registers).vrs.num;
          *(byte *)piVar1 = (byte)*piVar1 ^ 0x20;
        }
        goto LAB_0016a05b;
      }
      bVar8 = parseVfpuRegister(this_00,parser,local_f8,(this->opcodeData).vfpuSize);
      pMVar11 = local_f8;
    }
    bVar8 = (bool)(bVar8 & pMVar11->type == VfpuMatrix);
    break;
  case 0x72:
    bVar8 = parseRegister(this_00,parser,(MipsRegisterValue *)local_60);
    if ((bVar8) && (local_128._0_8_ = pbVar12 + 2, local_38 == (int)(char)pbVar12[1]))
    goto LAB_0016a05b;
    goto LAB_0016a0a3;
  case 0x73:
    bVar8 = parseRegister(this_00,parser,(MipsRegisterValue *)this);
    break;
  case 0x74:
    bVar8 = parseRegister(this_00,parser,(MipsRegisterValue *)local_e0._M_allocated_capacity);
    break;
  case 0x76:
    if (*(byte *)local_128._0_8_ == 0x53) {
      local_128._0_8_ = pbVar12 + 2;
      local_128._12_4_ = 0;
    }
    pbVar12 = (byte *)(local_128._0_8_ + 1);
    bVar7 = *(byte *)local_128._0_8_;
    bVar8 = false;
    local_128._0_8_ = pbVar12;
    if (bVar7 < 0x73) {
      if (bVar7 == 99) {
        bVar8 = parseVfpuControlRegister(this_00,parser,(MipsRegisterValue *)local_128._24_8_);
        break;
      }
      if (bVar7 == 100) {
        bVar8 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_128._24_8_,
                                  local_128._12_4_);
        if (!bVar8 || *(int *)local_128._24_8_ != 7) goto LAB_0016a0a3;
        if ((opcode->flags & 0x40000) != 0) {
          bVar7 = (byte)(this->registers).vrd.num;
          goto joined_r0x00169f91;
        }
        goto LAB_0016a05b;
      }
      goto switchD_00169a73_caseD_64;
    }
    if (bVar7 != 0x74) {
      if (bVar7 == 0x73) {
        bVar8 = parseVfpuRegister(this_00,parser,(MipsRegisterValue *)local_128._40_8_,
                                  local_128._12_4_);
        if (bVar8 && *(MipsRegisterType *)local_128._40_8_ == VfpuVector) {
          if ((opcode->flags & 0x40000) != 0) {
            bVar7 = (byte)(this->registers).vrs.num;
joined_r0x00169f91:
            if ((bVar7 & 0x40) != 0) goto LAB_0016a0a3;
          }
          goto LAB_0016a05b;
        }
        goto LAB_0016a0a3;
      }
      goto switchD_00169a73_caseD_64;
    }
    bVar8 = parseVfpuRegister(this_00,parser,local_f8,local_128._12_4_);
    if (bVar8 && local_f8->type == VfpuVector) {
      if ((opcode->flags & 0x40000) != 0) {
        bVar7 = (byte)(this->registers).vrt.num;
        goto joined_r0x00169f91;
      }
      goto LAB_0016a05b;
    }
    goto LAB_0016a0a3;
  case 0x77:
    bVar8 = parseWb(this_00,parser);
    break;
  case 0x7a:
    bVar8 = parseCop0Register(this_00,parser,(MipsRegisterValue *)local_128._16_8_);
    break;
  default:
    if (bVar7 == 0x43) {
      bVar8 = parseVfpuCondition(this_00,parser,(int *)local_80._M_allocated_capacity);
    }
    else {
      if (bVar7 != 0x44) goto switchD_00169990_caseD_55;
      bVar8 = parseFpuRegister(this_00,parser,local_88);
    }
  }
  if (bVar8 == false) {
LAB_0016a0a3:
    bVar8 = false;
    goto switchD_00169a73_caseD_64;
  }
LAB_0016a05b:
  bVar7 = *(byte *)local_128._0_8_;
  pbVar12 = (byte *)local_128._0_8_;
  if (bVar7 == 0) goto LAB_0016a06a;
  goto LAB_00169975;
}

Assistant:

bool MipsParser::parseParameters(Parser& parser, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = MipsImmediateType::None;
	if (!hasFixedSecondaryImmediate)
		immediate.secondary.type = MipsImmediateType::None;

	if (opcodeData.vfpuSize == -1)
	{
		if (opcode.flags & MO_VFPU_SINGLE)
			opcodeData.vfpuSize = 0;
		else if (opcode.flags & MO_VFPU_PAIR)
			opcodeData.vfpuSize = 1;
		else if (opcode.flags & MO_VFPU_TRIPLE)
			opcodeData.vfpuSize = 2;
		else if (opcode.flags & MO_VFPU_QUAD)
			opcodeData.vfpuSize = 3;
	}

	// parse parameters
	MipsRegisterValue tempRegister;
	int actualSize = opcodeData.vfpuSize;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'T':	// float register
			CHECK(parseFpuRegister(parser,registers.frt));
			break;
		case 'D':	// float register
			CHECK(parseFpuRegister(parser,registers.frd));
			break;
		case 'S':	// float register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'f':	// fpu control register
			CHECK(parseFpuControlRegister(parser,registers.frs));
			break;
		case 'z':	// cop0 register
			CHECK(parseCop0Register(parser,registers.grd));
			break;
		case 'v':	// psp vfpu reg
			if (*encoding == 'S')
			{
				encoding++;
				actualSize = 0;
			}

			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,actualSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrs.num & 0x40));
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,actualSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrt.num & 0x40));
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,actualSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrd.num & 0x40));
				break;
			case 'c':
				CHECK(parseVfpuControlRegister(parser,registers.vrd));
				break;
			default:
				return false;
			}
			break;
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,opcodeData.vfpuSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuMatrix);
				if (opcode.flags & MO_VFPU_TRANSPOSE_VS)
					registers.vrs.num ^= 0x20;
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,opcodeData.vfpuSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuMatrix);
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,opcodeData.vfpuSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuMatrix);
				break;
			default:
				return false;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 't':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrt));
				break;
			case 'd':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrd));
				break;
			case 's':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrs));
				break;
			default:
				return false;
			}
			break;
		case 'g':	// psx cop2 reg
			switch (*encoding++)
			{
			case 't':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grt));
				break;
			case 's':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grd));
				break;
			case 'c':	// gte control register
				CHECK(parsePsxCop2ControlRegister(parser,registers.grd));
				break;
			default:
				return false;
			}
			break;
		case 'r':	// forced register
			CHECK(parseRegister(parser,tempRegister));
			CHECK(tempRegister.num == *encoding++);
			break;
		case 'R':	// rsp register
			switch (*encoding++)
			{
			case 'z':	// cop0 register
				CHECK(parseRspCop0Register(parser,registers.grd));
				break;
			case 'c':	// vector control register
				CHECK(parseRspVectorControlRegister(parser,registers.grd));
				break;
			case 't':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrt));
				break;
			case 'd':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrd));
				break;
			case 's':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrs));
				break;
			case 'e':	// vector element
				CHECK(parseRspVectorElement(parser,registers.rspve));
				break;
			case 'l':	// scalar element
				CHECK(parseRspScalarElement(parser,registers.rspve));
				break;
			case 'm':	// scalar destination element
				CHECK(parseRspScalarElement(parser,registers.rspvde));
				break;
			case 'o':	// byte offset element
				CHECK(parseRspOffsetElement(parser,registers.rspvealt));
				break;
			default:
				return false;
			}
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case 'j':	// secondary immediate
			switch (*encoding++)
			{
			case 'c':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::CacheOp;
				break;
			case 'e':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ext;
				break;
			case 'i':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ins;
				break;
			case 'b':
				CHECK(parseCop2BranchCondition(parser,immediate.secondary.originalValue));
				immediate.secondary.type = MipsImmediateType::Cop2BranchType;
				immediate.secondary.value = immediate.secondary.originalValue;
				break;
			default:
				return false;
			}
			break;
		case 'C':	// vfpu condition
			CHECK(parseVfpuCondition(parser,opcodeData.vectorCondition));
			break;
		case 'W':	// vfpu argument
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVpfxsParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate20_0;
				break;
			case 'd':
				CHECK(parseVpfxdParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate16;
				break;
			case 'c':
				CHECK(parseVcstParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			case 'r':
				CHECK(parseVfpuVrot(parser,immediate.primary.originalValue,opcodeData.vfpuSize));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			default:
				return false;
			}
			break;
		case 'w':	// 'wb' characters
			CHECK(parseWb(parser));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;
	setOmittedRegisters(opcode);

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}